

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O3

TCHAR * MakeCdnList(CASC_CSV *Csv,size_t *Indices)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  TCHAR *pTVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  TCHAR *szBuffer;
  char *__s;
  char szHostPath [128];
  char szHostsList [256];
  char local_1b8 [392];
  
  pTVar4 = (TCHAR *)0x0;
  memset(local_1b8 + 0x80,0,0x100);
  local_1b8[0x70] = '\0';
  local_1b8[0x71] = '\0';
  local_1b8[0x72] = '\0';
  local_1b8[0x73] = '\0';
  local_1b8[0x74] = '\0';
  local_1b8[0x75] = '\0';
  local_1b8[0x76] = '\0';
  local_1b8[0x77] = '\0';
  local_1b8[0x78] = '\0';
  local_1b8[0x79] = '\0';
  local_1b8[0x7a] = '\0';
  local_1b8[0x7b] = '\0';
  local_1b8[0x7c] = '\0';
  local_1b8[0x7d] = '\0';
  local_1b8[0x7e] = '\0';
  local_1b8[0x7f] = '\0';
  local_1b8[0x60] = '\0';
  local_1b8[0x61] = '\0';
  local_1b8[0x62] = '\0';
  local_1b8[99] = '\0';
  local_1b8[100] = '\0';
  local_1b8[0x65] = '\0';
  local_1b8[0x66] = '\0';
  local_1b8[0x67] = '\0';
  local_1b8[0x68] = '\0';
  local_1b8[0x69] = '\0';
  local_1b8[0x6a] = '\0';
  local_1b8[0x6b] = '\0';
  local_1b8[0x6c] = '\0';
  local_1b8[0x6d] = '\0';
  local_1b8[0x6e] = '\0';
  local_1b8[0x6f] = '\0';
  local_1b8[0x50] = '\0';
  local_1b8[0x51] = '\0';
  local_1b8[0x52] = '\0';
  local_1b8[0x53] = '\0';
  local_1b8[0x54] = '\0';
  local_1b8[0x55] = '\0';
  local_1b8[0x56] = '\0';
  local_1b8[0x57] = '\0';
  local_1b8[0x58] = '\0';
  local_1b8[0x59] = '\0';
  local_1b8[0x5a] = '\0';
  local_1b8[0x5b] = '\0';
  local_1b8[0x5c] = '\0';
  local_1b8[0x5d] = '\0';
  local_1b8[0x5e] = '\0';
  local_1b8[0x5f] = '\0';
  local_1b8[0x40] = '\0';
  local_1b8[0x41] = '\0';
  local_1b8[0x42] = '\0';
  local_1b8[0x43] = '\0';
  local_1b8[0x44] = '\0';
  local_1b8[0x45] = '\0';
  local_1b8[0x46] = '\0';
  local_1b8[0x47] = '\0';
  local_1b8[0x48] = '\0';
  local_1b8[0x49] = '\0';
  local_1b8[0x4a] = '\0';
  local_1b8[0x4b] = '\0';
  local_1b8[0x4c] = '\0';
  local_1b8[0x4d] = '\0';
  local_1b8[0x4e] = '\0';
  local_1b8[0x4f] = '\0';
  local_1b8[0x30] = '\0';
  local_1b8[0x31] = '\0';
  local_1b8[0x32] = '\0';
  local_1b8[0x33] = '\0';
  local_1b8[0x34] = '\0';
  local_1b8[0x35] = '\0';
  local_1b8[0x36] = '\0';
  local_1b8[0x37] = '\0';
  local_1b8[0x38] = '\0';
  local_1b8[0x39] = '\0';
  local_1b8[0x3a] = '\0';
  local_1b8[0x3b] = '\0';
  local_1b8[0x3c] = '\0';
  local_1b8[0x3d] = '\0';
  local_1b8[0x3e] = '\0';
  local_1b8[0x3f] = '\0';
  local_1b8[0x20] = '\0';
  local_1b8[0x21] = '\0';
  local_1b8[0x22] = '\0';
  local_1b8[0x23] = '\0';
  local_1b8[0x24] = '\0';
  local_1b8[0x25] = '\0';
  local_1b8[0x26] = '\0';
  local_1b8[0x27] = '\0';
  local_1b8[0x28] = '\0';
  local_1b8[0x29] = '\0';
  local_1b8[0x2a] = '\0';
  local_1b8[0x2b] = '\0';
  local_1b8[0x2c] = '\0';
  local_1b8[0x2d] = '\0';
  local_1b8[0x2e] = '\0';
  local_1b8[0x2f] = '\0';
  local_1b8[0x10] = '\0';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = '\0';
  local_1b8[0x16] = '\0';
  local_1b8[0x17] = '\0';
  local_1b8[0x18] = '\0';
  local_1b8[0x19] = '\0';
  local_1b8[0x1a] = '\0';
  local_1b8[0x1b] = '\0';
  local_1b8[0x1c] = '\0';
  local_1b8[0x1d] = '\0';
  local_1b8[0x1e] = '\0';
  local_1b8[0x1f] = '\0';
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  iVar1 = CASC_CSV::GetString(Csv,local_1b8 + 0x80,0xff,*Indices);
  if (iVar1 == 0) {
    iVar1 = CASC_CSV::GetString(Csv,local_1b8,0x80,Indices[1]);
    pTVar4 = (TCHAR *)0x0;
    if ((iVar1 == 0) && (local_1b8[0x80] != '\0')) {
      __s = local_1b8 + 0x80;
      sVar2 = strlen(__s);
      sVar3 = strlen(local_1b8);
      if (sVar2 == 0xffffffffffffffff) {
        lVar6 = 1;
      }
      else {
        lVar6 = 1;
        lVar7 = 0;
        do {
          if (local_1b8[lVar7 + 0x80] == ' ') {
            local_1b8[lVar7 + 0x80] = '\0';
            lVar6 = lVar6 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (sVar2 + 1 != lVar7);
      }
      lVar6 = sVar2 + (sVar3 + 1) * lVar6;
      pTVar4 = (TCHAR *)malloc(lVar6 + 2);
      if (pTVar4 == (TCHAR *)0x0) {
        pTVar4 = (TCHAR *)0x0;
      }
      else if (local_1b8[0x80] != '\0') {
        szBuffer = pTVar4;
        do {
          sVar5 = CombineUrlPath(szBuffer,(size_t)(pTVar4 + ((lVar6 + 1) - (long)szBuffer)),__s,
                                 local_1b8);
          if (sVar5 == 0) {
            return pTVar4;
          }
          szBuffer[sVar5 + 1] = '\0';
          sVar2 = strlen(__s);
          __s = __s + sVar2 + 1;
          szBuffer = szBuffer + sVar5 + 1;
        } while (*__s != '\0');
      }
    }
  }
  return pTVar4;
}

Assistant:

static TCHAR * MakeCdnList(CASC_CSV & Csv, size_t * Indices)
{
    TCHAR * szCdnList = NULL;
    TCHAR * szCdnPtr;
    TCHAR * szCdnEnd;
    const char * szHostPtr;
    char szHostsList[0x100] = { 0 };
    char szHostPath[0x80] = { 0 };

    // Retrieve both strings
    if (Csv.GetString(szHostsList, sizeof(szHostsList) - 1, Indices[0]) != ERROR_SUCCESS)
        return NULL;
    if (Csv.GetString(szHostPath, sizeof(szHostPath), Indices[1]) != ERROR_SUCCESS)
        return NULL;
    
    // Did we retrieve something?
    if (szHostsList[0] != 0)
    {
        size_t nCombinedLength;
        size_t nHostsLength = strlen(szHostsList) + 1;
        size_t nPathLength = strlen(szHostPath);
        size_t cbToAllocate;
        size_t nHostsCount = 1;

        // Cut the hosts list to pieces
        for (size_t i = 0; i < nHostsLength; i++)
        {
            if (szHostsList[i] == ' ')
            {
                szHostsList[i] = 0;
                nHostsCount++;
            }
        }

        // Merge the hosts list
        cbToAllocate = nHostsLength + (nPathLength + 1) * nHostsCount + 1;
        szCdnList = szCdnPtr = CASC_ALLOC(TCHAR, cbToAllocate);
        szCdnEnd = szCdnList + cbToAllocate - 1;
        if (szCdnList != NULL)
        {
            for (szHostPtr = szHostsList; szHostPtr[0] != 0; szHostPtr += strlen(szHostPtr) + 1)
            {
                nCombinedLength = CombineUrlPath(szCdnPtr, (szCdnEnd - szCdnPtr), szHostPtr, szHostPath);
                if (nCombinedLength == 0)
                    break;

                szCdnPtr += nCombinedLength + 1;
                szCdnPtr[0] = 0;
            }
        }
    }

    return szCdnList;
}